

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.h
# Opt level: O0

void __thiscall
spvtools::opt::RegisterLiveness::RegionRegisterLiveness::AddRegisterClass
          (RegionRegisterLiveness *this,RegisterClass *reg_class)

{
  bool bVar1;
  pointer ppVar2;
  unsigned_long local_48;
  __normal_iterator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_*,_std::vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>_>
  local_40;
  pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long> *local_38;
  pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long> *local_30;
  __normal_iterator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_*,_std::vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>_>
  local_28;
  __normal_iterator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_*,_std::vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>_>
  local_20;
  __normal_iterator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_*,_std::vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>_>
  it;
  RegisterClass *reg_class_local;
  RegionRegisterLiveness *this_local;
  
  it._M_current = (pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long> *)reg_class;
  local_28._M_current =
       (pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long> *)
       std::
       vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
       ::begin(&this->registers_classes_);
  local_30 = (pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long> *)
             std::
             vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
             ::end(&this->registers_classes_);
  local_38 = it._M_current;
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>*,std::vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>,std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>>>>,spvtools::opt::RegisterLiveness::RegionRegisterLiveness::AddRegisterClass(spvtools::opt::RegisterLiveness::RegisterClass_const&)::_lambda(std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>const&)_1_>
                       (local_28,(__normal_iterator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_*,_std::vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>_>
                                  )local_30,it._M_current);
  local_40._M_current =
       (pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long> *)
       std::
       vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>
       ::end(&this->registers_classes_);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_40);
  if (bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_*,_std::vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,_unsigned_long>_>_>_>
             ::operator->(&local_20);
    ppVar2->second = ppVar2->second + 1;
  }
  else {
    local_48 = 1;
    std::
    vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>,std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>>>
    ::emplace_back<spvtools::opt::RegisterLiveness::RegisterClass_const,unsigned_long>
              ((vector<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>,std::allocator<std::pair<spvtools::opt::RegisterLiveness::RegisterClass,unsigned_long>>>
                *)&this->registers_classes_,&(it._M_current)->first,&local_48);
  }
  return;
}

Assistant:

void AddRegisterClass(const RegisterClass& reg_class) {
      auto it = std::find_if(
          registers_classes_.begin(), registers_classes_.end(),
          [&reg_class](const std::pair<RegisterClass, size_t>& class_count) {
            return class_count.first == reg_class;
          });
      if (it != registers_classes_.end()) {
        it->second++;
      } else {
        registers_classes_.emplace_back(std::move(reg_class),
                                        static_cast<size_t>(1));
      }
    }